

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CombinationApprovals.h
# Opt level: O0

void __thiscall
ApprovalTests::
TCombinationApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>>::
serialize<DOCTEST_ANON_FUNC_2()::$_0>::operator()
          (serialize<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_tests_DocTest_Tests_docs_CombinationsSampleCode_cpp:23:9)>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input1_,
          int *inputs,double *inputs_1)

{
  string *input1;
  ostream *poVar1;
  tuple<int_&,_double_&> *in_RDI;
  double dVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000118;
  print_input *in_stack_ffffffffffffff78;
  string *this_00;
  string local_40 [64];
  
  input1 = (string *)
           ::std::operator<<((ostream *)
                             (in_RDI->super__Tuple_impl<0UL,_int_&,_double_&>).
                             super__Tuple_impl<1UL,_double_&>.super__Head_base<1UL,_double_&,_false>
                             ._M_head_impl,"(");
  this_00 = local_40;
  StringMaker::toString<std::__cxx11::string>(in_stack_00000118);
  ::std::operator<<((ostream *)input1,this_00);
  ::std::__cxx11::string::~string(local_40);
  ::std::forward_as_tuple<int&,double&>((int *)input1,(double *)in_RDI);
  CartesianProduct::Detail::
  for_each<std::tuple<int&,double&>,ApprovalTests::TCombinationApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>>::print_input>
            (in_RDI,in_stack_ffffffffffffff78);
  poVar1 = ::std::operator<<((ostream *)
                             (in_RDI->super__Tuple_impl<0UL,_int_&,_double_&>).
                             super__Tuple_impl<1UL,_double_&>.super__Head_base<1UL,_double_&,_false>
                             ._M_head_impl,") => ");
  dVar2 = TCombinationApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>
          ::
          serialize<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/tests/DocTest_Tests/docs/CombinationsSampleCode.cpp:23:9)>
          ::anon_class_1_0_00000001_for_converter::operator()
                    ((anon_class_1_0_00000001_for_converter *)this_00,input1,
                     (int)((ulong)in_RDI >> 0x20),(double)poVar1);
  poVar1 = (ostream *)::std::ostream::operator<<(poVar1,dVar2);
  ::std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void operator()(T&& input1_, Ts&&... inputs)
            {
                // First value is printed without trailing comma
                out << "(" << TCompileTimeOptions::ToStringConverter::toString(input1_);
                // Remaining values are printed with prefix of a comma
                CartesianProduct::Detail::for_each(std::forward_as_tuple(inputs...),
                                                   print_input{out});
                out << ") => " << converter(input1_, inputs...) << '\n';
            }